

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O0

void aiMultiplyMatrix3(aiMatrix3x3 *dst,aiMatrix3x3 *src)

{
  aiMatrix3x3t<float> local_3c;
  aiMatrix3x3 *local_18;
  aiMatrix3x3 *src_local;
  aiMatrix3x3 *dst_local;
  
  local_18 = src;
  src_local = dst;
  if (dst == (aiMatrix3x3 *)0x0) {
    __assert_fail("__null != dst",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                  ,0x28d,"void aiMultiplyMatrix3(aiMatrix3x3 *, const aiMatrix3x3 *)");
  }
  if (src != (aiMatrix3x3 *)0x0) {
    aiMatrix3x3t<float>::operator*(&local_3c,dst,src);
    memcpy(src_local,&local_3c,0x24);
    return;
  }
  __assert_fail("__null != src",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                ,0x28e,"void aiMultiplyMatrix3(aiMatrix3x3 *, const aiMatrix3x3 *)");
}

Assistant:

ASSIMP_API void aiMultiplyMatrix3(
    aiMatrix3x3* dst,
    const aiMatrix3x3* src)
{
    ai_assert( NULL != dst );
    ai_assert( NULL != src );
    *dst = (*dst) * (*src);
}